

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O2

void __thiscall Catch::XmlReporter::benchmarkFailed(XmlReporter *this,StringRef error)

{
  StringRef name;
  allocator<char> local_51;
  ScopedElement local_50;
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_40,"failed",&local_51);
  XmlWriter::scopedElement((XmlWriter *)&local_50,(string *)&this->m_xml,(XmlFormatting)local_40);
  name.m_size = 7;
  name.m_start = "message";
  XmlWriter::writeAttribute(local_50.m_writer,name,error);
  XmlWriter::ScopedElement::~ScopedElement(&local_50);
  std::__cxx11::string::~string(local_40);
  XmlWriter::endElement(&this->m_xml,Newline|Indent);
  return;
}

Assistant:

void XmlReporter::benchmarkFailed(StringRef error) {
        m_xml.scopedElement("failed").
            writeAttribute("message"_sr, error);
        m_xml.endElement();
    }